

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  long lVar1;
  mz_uint8 *pExt;
  int iVar2;
  int iVar3;
  int iVar4;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar5;
  undefined8 uVar6;
  size_t sVar7;
  uint uVar8;
  mz_bool mVar9;
  size_t sVar10;
  int *piVar11;
  short *psVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  mz_uint64 mVar17;
  void *pvVar18;
  uint uVar19;
  ulong uVar20;
  void *pvVar21;
  undefined8 uVar22;
  mz_uint64 mVar23;
  int *pCentral_dir_header;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffa90;
  ulong local_558;
  uint local_53c;
  ulong local_538;
  undefined8 local_530;
  uint local_524;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  int local_508;
  byte local_502;
  int local_4f6;
  int local_4f2;
  ushort local_4ee;
  ushort local_4ec;
  short *local_4e0;
  mz_zip_array local_4d8;
  undefined6 uStack_4b8;
  undefined4 uStack_4b2;
  undefined4 uStack_4ae;
  mz_zip_array local_4a8;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar5 = pSource_zip->m_pState, pmVar5->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar18 = (pmVar5->m_central_dir).m_p, pvVar18 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar18 +
              (ulong)*(uint *)((long)(pmVar5->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_0011f622:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_520 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_518 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_524 = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar13 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                   (uint)*(ushort *)(pCentral_dir_header + 7) + local_524);
  if (((pArray->m_central_dir).m_size + uVar13) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_0011f3b2;
  if (pZip->m_file_offset_alignment == 0) {
    uVar8 = 0;
  }
  else {
    iVar2 = (int)pZip->m_file_offset_alignment;
    uVar8 = iVar2 - 1;
    uVar8 = iVar2 - ((uint)pZip->m_archive_size & uVar8) & uVar8;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) {
LAB_0011f639:
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) goto LAB_0011f639;
  uVar22 = 0;
  mVar9 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_488,
                     (mz_bool *)0x0);
  mVar17 = local_488.m_local_header_ofs;
  if (mVar9 == 0) {
    return 0;
  }
  mVar23 = pZip->m_archive_size;
  sVar10 = (*pSource_zip->m_pRead)
                     (pSource_zip->m_pIO_opaque,local_488.m_local_header_ofs,&local_508,0x1e);
  if (sVar10 != 0x1e) goto LAB_0011fa8b;
  if (local_508 != 0x4034b50) goto LAB_0011f622;
  uVar16 = ((uint)local_4ec + (uint)local_4ee) + local_488.m_comp_size;
  if ((local_4ec == 0) || ((local_4f6 != -1 && (local_4f2 != -1)))) {
    local_530 = (ulong)local_530._4_4_ << 0x20;
  }
  else {
    uVar14 = (ulong)local_4ec;
    local_4d8.m_p = (short *)0x0;
    local_4d8.m_size._0_6_ = 0;
    local_4d8.m_size._6_2_ = 0;
    local_4d8.m_capacity._0_4_ = 0;
    local_4d8.m_capacity._4_2_ = 0;
    local_4d8.m_capacity._6_2_ = 0;
    local_4d8._28_2_ = 0;
    local_4d8._30_2_ = 0;
    local_4d8.m_element_size = 1;
    local_538 = (ulong)local_4ee;
    local_530 = (ulong)local_4ec;
    mVar9 = mz_zip_array_ensure_capacity(pZip,&local_4d8,uVar14,0);
    if (mVar9 == 0) {
      local_538._0_4_ = MZ_ZIP_ALLOC_FAILED;
LAB_0011f72b:
      pZip->m_last_error = (mz_zip_error)local_538;
      return 0;
    }
    local_4e0 = (short *)local_4d8.m_p;
    sVar10 = (*pSource_zip->m_pRead)
                       (pSource_zip->m_pIO_opaque,local_538 + 0x1e + local_488.m_local_header_ofs,
                        local_4d8.m_p,uVar14);
    local_538 = CONCAT44(local_538._4_4_,0x14);
    psVar12 = local_4e0;
    uVar20 = local_530;
    if (sVar10 != uVar14) {
LAB_0011f720:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e0);
      goto LAB_0011f72b;
    }
    do {
      uVar19 = (uint)uVar20;
      if (uVar19 < 4) {
LAB_0011f718:
        local_538 = CONCAT44(local_538._4_4_,9);
        goto LAB_0011f720;
      }
      lVar1 = (ulong)(ushort)psVar12[1] + 4;
      uVar15 = (uint)lVar1;
      if (uVar19 < uVar15) goto LAB_0011f718;
      uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),*psVar12 == 1);
      if (*psVar12 == 1) {
        local_538 = CONCAT44(local_538._4_4_,9);
        if ((ushort)psVar12[1] < 0x10) goto LAB_0011f720;
        break;
      }
      uVar19 = uVar19 - uVar15;
      psVar12 = (short *)((long)psVar12 + lVar1);
      uVar20 = (ulong)uVar19;
    } while (uVar19 != 0);
    local_530 = CONCAT44(local_530._4_4_,(int)uVar22);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e0);
  }
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < (pArray->m_central_dir).m_size + 0xb2 + uVar8 + uVar13 + mVar23 + uVar16)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar9 = mz_zip_writer_write_zeros(pZip,mVar23,uVar8);
  if (mVar9 == 0) {
    return 0;
  }
  local_558 = mVar23 + uVar8;
  local_510 = local_558;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & local_558) != 0)
     ) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0x21f4,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_558,&local_508,0x1e);
  if (sVar10 != 0x1e) goto LAB_0011fc77;
  uVar14 = 0x10000;
  if (uVar16 < 0x10000) {
    uVar14 = uVar16;
  }
  sVar10 = 0x20;
  if (0x20 < uVar14) {
    sVar10 = uVar14;
  }
  piVar11 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar10);
  if (piVar11 == (int *)0x0) goto LAB_0011fccd;
  local_558 = local_558 + 0x1e;
  mVar17 = mVar17 + 0x1e;
  mVar23 = local_558;
  for (; uVar16 != 0; uVar16 = uVar16 - mVar23) {
    mVar23 = 0x10000;
    if (uVar16 < 0x10000) {
      mVar23 = uVar16;
    }
    sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar11,mVar23);
    if (sVar10 != mVar23) goto LAB_0011fa7f;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_558,piVar11,mVar23);
    if (sVar10 != mVar23) goto LAB_0011fc6b;
    local_558 = local_558 + mVar23;
    mVar17 = mVar17 + mVar23;
  }
  local_53c = (uint)mVar23;
  if ((local_502 & 8) != 0) {
    if ((~(byte)local_530 & pSource_zip->m_pState->m_zip64 == 0) == 0) {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar11,0x18);
      if (sVar10 != 0x18) {
LAB_0011fa7f:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
LAB_0011fa8b:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_53c = (uint)(*piVar11 == 0x8074b50) * 4 + 0x14;
    }
    else {
      sVar10 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar17,piVar11,0x10);
      if (sVar10 != 0x10) goto LAB_0011fa7f;
      if (pZip->m_pState->m_zip64 == 0) {
        local_53c = (uint)(*piVar11 == 0x8074b50) * 4 + 0xc;
      }
      else {
        uVar16 = (ulong)(*piVar11 == 0x8074b50);
        iVar2 = piVar11[uVar16];
        iVar3 = piVar11[uVar16 + 1];
        iVar4 = piVar11[uVar16 + 2];
        *piVar11 = 0x8074b50;
        *(char *)(piVar11 + 1) = (char)iVar2;
        *(char *)((long)piVar11 + 5) = (char)((uint)iVar2 >> 8);
        *(char *)((long)piVar11 + 6) = (char)((uint)iVar2 >> 0x10);
        *(char *)((long)piVar11 + 7) = (char)((uint)iVar2 >> 0x18);
        *(char *)(piVar11 + 2) = (char)iVar3;
        *(char *)((long)piVar11 + 9) = (char)((uint)iVar3 >> 8);
        *(char *)((long)piVar11 + 10) = (char)((uint)iVar3 >> 0x10);
        *(char *)((long)piVar11 + 0xb) = (char)((uint)iVar3 >> 0x18);
        piVar11[3] = 0;
        *(char *)(piVar11 + 4) = (char)iVar4;
        *(char *)((long)piVar11 + 0x11) = (char)((uint)iVar4 >> 8);
        *(char *)((long)piVar11 + 0x12) = (char)((uint)iVar4 >> 0x10);
        *(char *)((long)piVar11 + 0x13) = (char)((uint)iVar4 >> 0x18);
        piVar11[5] = 0;
        local_53c = 0x18;
      }
    }
    uVar16 = (ulong)local_53c;
    sVar10 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_558,piVar11,uVar16);
    if (sVar10 != uVar16) {
LAB_0011fc6b:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
LAB_0011fc77:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    local_558 = local_558 + uVar16;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar11);
  local_4d8.m_p = *(void **)pCentral_dir_header;
  uVar22 = *(undefined8 *)(pCentral_dir_header + 4);
  uVar6 = *(undefined8 *)(pCentral_dir_header + 6);
  uVar16 = (pArray->m_central_dir).m_size;
  uStack_4b8 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  local_4d8.m_size._0_6_ = (undefined6)*(undefined8 *)(pCentral_dir_header + 2);
  local_4d8.m_size._6_2_ = (undefined2)((ulong)*(undefined8 *)(pCentral_dir_header + 2) >> 0x30);
  local_4d8.m_capacity._0_4_ = (undefined4)uVar22;
  local_4d8.m_capacity._4_2_ = (undefined2)((ulong)uVar22 >> 0x20);
  local_4d8.m_capacity._6_2_ = (undefined2)((ulong)uVar22 >> 0x30);
  local_4d8.m_element_size = (mz_uint)uVar6;
  local_4d8._28_2_ = SUB82((ulong)uVar6 >> 0x20,0);
  local_4d8._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
  uStack_4b2 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_558 >> 0x20 != 0) || (0xfffffffe < local_510)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_4b2 = CONCAT44((int)local_510,uStack_4b2);
    uVar14 = uVar16 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar14) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar9 == 0))
    goto LAB_0011fccd;
    (pArray->m_central_dir).m_size = uVar14;
    uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar16 * uVar14 + (long)(pArray->m_central_dir).m_p),&local_4d8,uVar14 * 0x2e);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar14 = sVar10 + uVar13;
    if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar9 != 0)) {
      (pArray->m_central_dir).m_size = uVar14;
      uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar10 * uVar14 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),uVar13 * uVar14);
LAB_0011fb82:
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
           (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,0), mVar9 != 0))
        {
          (pArray->m_central_dir).m_size = uVar16;
        }
LAB_0011f3b2:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_53c = (uint)uVar16;
      sVar10 = (pArray->m_central_dir_offsets).m_size;
      uVar13 = sVar10 + 1;
      if ((uVar13 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar13,1),
         mVar9 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar13;
        uVar13 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir_offsets).m_p),&local_53c,
               uVar13);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_558;
        return 1;
      }
    }
  }
  else {
    local_4d8.m_capacity._4_2_ = 0xffff;
    local_4d8.m_capacity._6_2_ = 0xffff;
    local_4d8.m_element_size = 0xffffffff;
    _uStack_4b2 = CONCAT44(0xffffffff,uStack_4b2);
    local_4a8._0_24_ = SUB3224(ZEXT832(0),0) << 0x20;
    local_4a8.m_element_size = 1;
    local_4a8._28_4_ = 0;
    pExt = (mz_uint8 *)((long)pCentral_dir_header + local_520 + 0x2e);
    mVar9 = mz_zip_writer_update_zip64_extension_block
                      (&local_4a8,pZip,pExt,local_524,&local_488.m_comp_size,
                       &local_488.m_uncomp_size,&local_510,in_stack_fffffffffffffa90);
    if (mVar9 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      return 0;
    }
    sVar7 = local_4a8.m_size;
    local_4d8._30_2_ = local_4a8.m_size._0_2_;
    sVar10 = (pArray->m_central_dir).m_size;
    uVar13 = sVar10 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      goto LAB_0011fccd;
    }
    (pArray->m_central_dir).m_size = uVar13;
    uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),&local_4d8,uVar13 * 0x2e);
    sVar10 = (pArray->m_central_dir).m_size;
    uVar13 = sVar10 + local_520;
    if (((pArray->m_central_dir).m_capacity < uVar13) &&
       (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 == 0)) {
      pvVar21 = pZip->m_pAlloc_opaque;
      pvVar18 = local_4a8.m_p;
    }
    else {
      (pArray->m_central_dir).m_size = uVar13;
      uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_520 * uVar13);
      sVar10 = (pArray->m_central_dir).m_size;
      pvVar18 = local_4a8.m_p;
      uVar13 = sVar10 + sVar7;
      if ((uVar13 <= (pArray->m_central_dir).m_capacity) ||
         (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 != 0)) {
        (pArray->m_central_dir).m_size = uVar13;
        uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),pvVar18,sVar7 * uVar13)
        ;
        sVar10 = (pArray->m_central_dir).m_size;
        uVar13 = sVar10 + local_518;
        if ((uVar13 <= (pArray->m_central_dir).m_capacity) ||
           (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar13,1), mVar9 != 0))
        {
          (pArray->m_central_dir).m_size = uVar13;
          uVar13 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar10 * uVar13 + (long)(pArray->m_central_dir).m_p),pExt + local_524,
                 local_518 * uVar13);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar18);
          goto LAB_0011fb82;
        }
      }
      pvVar21 = pZip->m_pAlloc_opaque;
    }
    (*pZip->m_pFree)(pvVar21,pvVar18);
  }
  if ((uVar16 <= (pArray->m_central_dir).m_capacity) ||
     (mVar9 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar16,0), mVar9 != 0)) {
    (pArray->m_central_dir).m_size = uVar16;
  }
LAB_0011fccd:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive* pZip, mz_zip_archive* pSource_zip,
                                                 mz_uint src_file_index) {

    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8* pLocal_header = (mz_uint8*)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state* pState;
    void* pBuf;
    const mz_uint8* pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the @library central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32)
            >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64) {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the @library archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                             cur_src_file_ofs,
                             pLocal_header,
                             MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len)
            && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX))) {
        mz_zip_array file_data_array;
        const mz_uint8* pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE)) {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                 src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE
                                         + local_header_filename_size,
                                 file_data_array.m_p,
                                 local_header_extra_len) != local_header_extra_len) {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8*)file_data_array.m_p;

        do {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining) {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
                const mz_uint8* pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2) {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(
                        pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64) {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size =
                          cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE
                                  + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) + pState->m_central_dir.m_size
                                  + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size
                                  + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment) {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque,
                       cur_dst_file_ofs,
                       pLocal_header,
                       MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the @library archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque,
                                       1,
                                       (size_t)MZ_MAX(32U,
                                                      MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE,
                                                             src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining) {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8) {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir)) {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                     cur_src_file_ofs,
                                     pBuf,
                                     (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6)) {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                     cur_src_file_ofs,
                                     pBuf,
                                     sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64) {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32* pSrc_descriptor = (const mz_uint32*)((const mz_uint8*)pBuf
                        + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8*)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8*)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8*)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8*)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64) {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8* pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block,
                                                        pZip,
                                                        pSrc_ext,
                                                        src_ext_len,
                                                        &src_file_stat.m_comp_size,
                                                        &src_file_stat.m_uncomp_size,
                                                        &local_dir_header_ofs,
                                                        NULL)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE,
                                    src_filename_len)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len
                                            + src_ext_len,
                                    src_comment_len)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE,
                                    src_central_dir_following_data_size)) {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX) {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}